

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,Var value)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  DynamicTypeHandler *pDVar6;
  RootObjectInlineCache *this;
  Type TVar7;
  
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01599240,FixDataPropsPhase);
  if (bVar2) {
    return true;
  }
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) goto LAB_00e4cc33;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pTVar5 = (instance->super_RecyclableObject).type.ptr;
  TVar7 = pTVar5->typeId;
  if (TVar7 == TypeIds_GlobalObject) {
    bVar2 = ScriptContext::IsIntConstPropertyOnGlobalObject
                      ((((pTVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyRecord->pid);
    if (bVar2) {
      return true;
    }
    pTVar5 = (instance->super_RecyclableObject).type.ptr;
    TVar7 = pTVar5->typeId;
  }
  if ((TVar7 == TypeIds_Object) &&
     (bVar2 = ScriptContext::IsIntConstPropertyOnGlobalUserObject
                        ((((pTVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                         scriptContext.ptr,propertyRecord->pid), bVar2)) {
    return true;
  }
LAB_00e4cc33:
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015aabd0,FixDataVarPropsPhase);
  if (bVar2) {
    pDVar6 = DynamicObject::GetTypeHandler(instance);
    if ((pDVar6->flags & 0x20) != 0) {
      return true;
    }
    if (((instance->super_RecyclableObject).type.ptr)->typeId == TypeIds_GlobalObject) {
      this = RootObjectBase::GetRootInlineCache
                       ((RootObjectBase *)instance,propertyRecord,false,true);
      uVar3 = RootObjectInlineCache::Release(this);
      return uVar3 < 2;
    }
  }
  return false;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, Var value)
    {
        if (PHASE_FORCE1(Js::FixDataPropsPhase))
        {
            return true;
        }

        if (Js::TaggedInt::Is(value) &&
            ((instance->GetTypeId() == TypeIds_GlobalObject && instance->GetScriptContext()->IsIntConstPropertyOnGlobalObject(propertyRecord->GetPropertyId())) ||
            (instance->GetTypeId() == TypeIds_Object && instance->GetScriptContext()->IsIntConstPropertyOnGlobalUserObject(propertyRecord->GetPropertyId()))))
        {
            return true;
        }

        // Disabled by default
        if (PHASE_ON1(Js::FixDataVarPropsPhase))
        {
            if (instance->GetTypeHandler()->GetFlags() & IsPrototypeFlag)
            {
                return true;
            }
            if (instance->GetType()->GetTypeId() == TypeIds_GlobalObject)
            {
                // if we have statically seen multiple stores - we should not do this optimization
                RootObjectInlineCache* cache = (static_cast<Js::RootObjectBase*>(instance))->GetRootInlineCache(propertyRecord, /*isLoadMethod*/ false, /*isStore*/ true);
                uint refCount = cache->Release();
                return refCount <= 1;
            }
        }
        return false;
    }